

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_perform(Curl_easy *data,_Bool *connected,_Bool *dophase_done)

{
  connectdata *conn_00;
  IMAP *pIVar1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  _Bool selected;
  imap_conn *imapc;
  IMAP *imap;
  connectdata *conn;
  CURLcode result;
  _Bool *dophase_done_local;
  _Bool *connected_local;
  Curl_easy *data_local;
  
  conn_00 = data->conn;
  pIVar1 = (data->req).p.imap;
  bVar2 = false;
  if ((*(uint *)&(data->req).field_0xd9 >> 0x11 & 1) != 0) {
    pIVar1->transfer = PPTRANSFER_INFO;
  }
  *dophase_done = false;
  if ((((pIVar1->mailbox != (char *)0x0) && ((conn_00->proto).ftpc.retr_size_saved != 0)) &&
      (iVar4 = curl_strequal(pIVar1->mailbox,(conn_00->proto).imapc.mailbox), iVar4 != 0)) &&
     (((pIVar1->uidvalidity == (char *)0x0 || ((conn_00->proto).ftpc.server_os == (char *)0x0)) ||
      (iVar4 = curl_strequal(pIVar1->uidvalidity,(conn_00->proto).ftpc.server_os), iVar4 != 0)))) {
    bVar2 = true;
  }
  if (((*(uint *)&(data->state).field_0x774 >> 0x11 & 1) == 0) &&
     ((data->set).mimepost.kind == MIMEKIND_NONE)) {
    if ((pIVar1->custom == (char *)0x0) || ((!bVar2 && (pIVar1->mailbox != (char *)0x0)))) {
      if ((pIVar1->custom == (char *)0x0) &&
         ((bVar2 && ((pIVar1->uid != (char *)0x0 || (pIVar1->mindex != (char *)0x0)))))) {
        conn._4_4_ = imap_perform_fetch(data);
      }
      else if ((pIVar1->custom == (char *)0x0) && ((bVar2 && (pIVar1->query != (char *)0x0)))) {
        conn._4_4_ = imap_perform_search(data);
      }
      else if (((pIVar1->mailbox == (char *)0x0) || (bVar2)) ||
              ((((pIVar1->custom == (char *)0x0 && (pIVar1->uid == (char *)0x0)) &&
                (pIVar1->mindex == (char *)0x0)) && (pIVar1->query == (char *)0x0)))) {
        conn._4_4_ = imap_perform_list(data);
      }
      else {
        conn._4_4_ = imap_perform_select(data);
      }
    }
    else {
      conn._4_4_ = imap_perform_list(data);
    }
  }
  else {
    conn._4_4_ = imap_perform_append(data);
  }
  if (conn._4_4_ == CURLE_OK) {
    data_local._4_4_ = imap_multi_statemach(data,dophase_done);
    _Var3 = Curl_conn_is_connected(conn_00,0);
    *connected = _Var3;
  }
  else {
    data_local._4_4_ = conn._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode imap_perform(struct Curl_easy *data, bool *connected,
                             bool *dophase_done)
{
  /* This is IMAP and no proxy */
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct IMAP *imap = data->req.p.imap;
  struct imap_conn *imapc = &conn->proto.imapc;
  bool selected = FALSE;

  DEBUGF(infof(data, "DO phase starts"));

  if(data->req.no_body) {
    /* Requested no body means no transfer */
    imap->transfer = PPTRANSFER_INFO;
  }

  *dophase_done = FALSE; /* not done yet */

  /* Determine if the requested mailbox (with the same UIDVALIDITY if set)
     has already been selected on this connection */
  if(imap->mailbox && imapc->mailbox &&
     strcasecompare(imap->mailbox, imapc->mailbox) &&
     (!imap->uidvalidity || !imapc->mailbox_uidvalidity ||
      strcasecompare(imap->uidvalidity, imapc->mailbox_uidvalidity)))
    selected = TRUE;

  /* Start the first command in the DO phase */
  if(data->state.upload || IS_MIME_POST(data))
    /* APPEND can be executed directly */
    result = imap_perform_append(data);
  else if(imap->custom && (selected || !imap->mailbox))
    /* Custom command using the same mailbox or no mailbox */
    result = imap_perform_list(data);
  else if(!imap->custom && selected && (imap->uid || imap->mindex))
    /* FETCH from the same mailbox */
    result = imap_perform_fetch(data);
  else if(!imap->custom && selected && imap->query)
    /* SEARCH the current mailbox */
    result = imap_perform_search(data);
  else if(imap->mailbox && !selected &&
         (imap->custom || imap->uid || imap->mindex || imap->query))
    /* SELECT the mailbox */
    result = imap_perform_select(data);
  else
    /* LIST */
    result = imap_perform_list(data);

  if(result)
    return result;

  /* Run the state-machine */
  result = imap_multi_statemach(data, dophase_done);

  *connected = Curl_conn_is_connected(conn, FIRSTSOCKET);

  if(*dophase_done)
    DEBUGF(infof(data, "DO phase is complete"));

  return result;
}